

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

void wiz_create_item_display
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  char local_78 [8];
  char buf [80];
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *m_local;
  
  buf._76_4_ = width;
  if (oid == L'\xffffd8f1') {
    if (choose_artifact) {
      my_strcpy(local_78,"All artifacts",0x50);
    }
    else {
      my_strcpy(local_78,"All objects",0x50);
    }
  }
  else {
    object_base_name(local_78,0x50,oid,true);
  }
  c_prt(curs_attrs[1][(int)(uint)cursor],local_78,row,col);
  return;
}

Assistant:

static void wiz_create_item_display(struct menu *m, int oid, bool cursor,
	int row, int col, int width)
{
	char buf[80];

	if (oid == WIZ_CREATE_ALL_MENU_ITEM) {
		if (choose_artifact) {
			my_strcpy(buf, "All artifacts", sizeof(buf));
		} else {
			my_strcpy(buf, "All objects", sizeof(buf));
		}
	} else {
		object_base_name(buf, sizeof(buf), oid, true);
	}

	c_prt(curs_attrs[CURS_KNOWN][0 != cursor], buf, row, col);
}